

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O3

void __thiscall gvr::MultiTexturedMesh::resizeTriangleList(MultiTexturedMesh *this,int tn)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  UVT *pUVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  UVT *pUVar9;
  ulong uVar10;
  long lVar11;
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)tn;
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x1c),8) == 0) {
    uVar10 = SUB168(auVar4 * ZEXT816(0x1c),0);
  }
  pUVar9 = (UVT *)operator_new__(uVar10);
  uVar8 = (this->super_Mesh).n;
  if (tn <= (int)uVar8) {
    uVar8 = tn;
  }
  pUVar3 = this->uvt;
  if ((int)uVar8 < 1) {
    if (pUVar3 == (UVT *)0x0) goto LAB_00130324;
  }
  else {
    uVar10 = (ulong)uVar8 + 1;
    lVar11 = (ulong)uVar8 * 0x1c;
    do {
      puVar1 = (undefined8 *)((long)pUVar3[-1].uv + lVar11);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)((long)pUVar3[-1].uv + lVar11 + 0xc);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)pUVar9[-1].uv + lVar11 + 0xc);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      puVar1 = (undefined8 *)((long)pUVar9[-1].uv + lVar11);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      uVar10 = uVar10 - 1;
      lVar11 = lVar11 + -0x1c;
    } while (1 < uVar10);
  }
  operator_delete__(pUVar3);
LAB_00130324:
  this->uvt = pUVar9;
  Mesh::resizeTriangleList(&this->super_Mesh,tn);
  return;
}

Assistant:

void MultiTexturedMesh::resizeTriangleList(int tn)
{
  UVT *p=new UVT [tn];

  for (int i=std::min(getTriangleCount(), tn)-1; i>=0; i--)
  {
    p[i]=uvt[i];
  }

  delete [] uvt;

  uvt=p;

  Mesh::resizeTriangleList(tn);
}